

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O1

Variable __thiscall LiteScript::CreateCallback(LiteScript *this,Memory *memory,uint id)

{
  Object *pOVar1;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *extraout_RDX_01;
  uint *puVar2;
  Variable VVar3;
  allocator<LiteScript::Namer> allocator;
  new_allocator<LiteScript::Namer> local_c9;
  Callback local_c8;
  
  Memory::Create((Memory *)this,(Type *)memory);
  Callback::Callback(&local_c8,memory,id);
  pOVar1 = Variable::operator->((Variable *)this);
  Callback::operator=((Callback *)pOVar1->data,&local_c8);
  puVar2 = extraout_RDX;
  if (local_c8.nsp.is_null == false) {
    __gnu_cxx::new_allocator<LiteScript::Namer>::destroy<LiteScript::Namer>
              (&local_c9,(Namer *)&local_c8.nsp);
    puVar2 = extraout_RDX_00;
  }
  local_c8.nsp.is_null = true;
  if (local_c8.This.is_null == false) {
    Variable::~Variable((Variable *)&local_c8.This);
    puVar2 = extraout_RDX_01;
  }
  VVar3.nb_ref = puVar2;
  VVar3.obj = (Object *)this;
  return VVar3;
}

Assistant:

LiteScript::Variable LiteScript::CreateCallback(Memory &memory, unsigned int id) {
    Variable res = memory.Create(Type::CALLBACK);
    res->GetData<Callback>() = Callback(memory, id);
    return res;
}